

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias.cpp
# Opt level: O3

int __thiscall ncnn::Bias::load_model(Bias *this,ModelBin *mb)

{
  Mat *pMVar1;
  int *piVar2;
  int iVar3;
  void *local_48;
  int *local_40;
  size_t local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  size_t local_20;
  
  (**mb->_vptr_ModelBin)(&local_48,mb,(ulong)(uint)this->bias_data_size,1);
  pMVar1 = &this->bias_data;
  if (pMVar1 != (Mat *)&local_48) {
    if (local_40 != (int *)0x0) {
      LOCK();
      *local_40 = *local_40 + 1;
      UNLOCK();
    }
    piVar2 = (this->bias_data).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (pMVar1->data != (void *)0x0)) {
        free(*(void **)((long)pMVar1->data + -8));
      }
    }
    (this->bias_data).data = local_48;
    (this->bias_data).refcount = local_40;
    (this->bias_data).elemsize = local_38;
    (this->bias_data).dims = (undefined4)local_30;
    (this->bias_data).w = local_30._4_4_;
    (this->bias_data).h = (undefined4)uStack_28;
    (this->bias_data).c = uStack_28._4_4_;
    (this->bias_data).cstep = local_20;
  }
  if (local_40 != (int *)0x0) {
    LOCK();
    *local_40 = *local_40 + -1;
    UNLOCK();
    if ((*local_40 == 0) && (local_48 != (void *)0x0)) {
      free(*(void **)((long)local_48 + -8));
    }
  }
  if ((pMVar1->data == (void *)0x0) ||
     (iVar3 = 0, (long)(this->bias_data).c * (this->bias_data).cstep == 0)) {
    iVar3 = -100;
  }
  return iVar3;
}

Assistant:

int Bias::load_model(const ModelBin& mb)
{
    bias_data = mb.load(bias_data_size, 1);
    if (bias_data.empty())
        return -100;

    return 0;
}